

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  iterator *piVar1;
  iterator *in_RCX;
  iterator *piVar2;
  iterator *in_RDX;
  
  if ((a == (iterator *)(kEmptyGroup + 0x10) || a == (iterator *)0x0) || (-1 < *(char *)&a->ctrl_))
  {
    if ((in_RDX == (iterator *)(kEmptyGroup + 0x10) || in_RDX == (iterator *)0x0) ||
       (-1 < *(char *)&in_RDX->ctrl_)) {
      if (a == (iterator *)(kEmptyGroup + 0x10) && in_RDX == (iterator *)(kEmptyGroup + 0x10)) {
LAB_0022ad11:
        return a == in_RDX;
      }
      if ((a == (iterator *)(kEmptyGroup + 0x10)) != (in_RDX == (iterator *)(kEmptyGroup + 0x10)))
      goto LAB_0022ad2d;
      if (a == (iterator *)0x0 || in_RDX == (iterator *)0x0) goto LAB_0022ad11;
      if ((in_RDX == (iterator *)kSooControl) == (a == (iterator *)kSooControl)) {
        if (a == (iterator *)kSooControl) {
          if (b == in_RCX) goto LAB_0022ad11;
        }
        else {
          piVar2 = in_RCX;
          piVar1 = in_RDX;
          if (in_RDX < a) {
            piVar2 = b;
            piVar1 = a;
            b = in_RCX;
          }
          if ((piVar1 < b) && (b <= piVar2)) goto LAB_0022ad11;
        }
      }
      operator==();
      goto LAB_0022ad23;
    }
  }
  else {
LAB_0022ad23:
    operator==();
  }
  operator==();
LAB_0022ad2d:
  operator==();
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }